

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  uint *puVar1;
  uint *puVar2;
  double dVar3;
  int iVar4;
  int32_t iVar5;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar6;
  int *idx;
  int *idx_00;
  pointer pBVar7;
  Item *pIVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  BreakpointSource BVar14;
  BreakpointSource BVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  int iVar21;
  int iVar22;
  DataKey DVar25;
  undefined8 uVar26;
  fpclass_type fVar23;
  int iVar24;
  long lVar29;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar30;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar31;
  undefined8 uVar32;
  uint *puVar33;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar34;
  undefined1 uVar35;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *v;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar36;
  pointer pnVar37;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  fpclass_type fVar43;
  bool bVar44;
  ulong uVar45;
  pointer pnVar46;
  pointer pnVar47;
  pointer pnVar48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar49;
  int nBp;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_848;
  uint local_83c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  int minIdx;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SPxId enterId;
  undefined1 local_768 [16];
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  uint local_738 [3];
  undefined3 uStack_72b;
  int iStack_728;
  bool bStack_724;
  undefined8 local_720;
  ulong local_718;
  pointer local_710;
  pointer local_708;
  pointer local_700;
  pointer local_6f8;
  cpp_dec_float<100U,_int,_void> *local_6f0;
  pointer local_6e8;
  pointer local_6e0;
  pointer local_6d8;
  pointer local_6d0;
  cpp_dec_float<100U,_int,_void> local_6c8;
  undefined1 local_678 [16];
  undefined1 local_668 [16];
  undefined1 local_658 [16];
  uint local_648 [3];
  undefined3 uStack_63b;
  int iStack_638;
  bool bStack_634;
  undefined8 local_630;
  cpp_dec_float<100U,_int,_void> local_628;
  SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x_1;
  BreakpointCompare local_4e0;
  cpp_dec_float<100U,_int,_void> local_4d8;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  undefined8 uVar27;
  undefined8 uVar28;
  
  iVar21 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->leaveCount;
  if ((iVar21 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar21 * 0x40000000) < 0x28f5c29) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              ((cpp_dec_float<100U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x174,1);
  }
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x171 != '\x01' || polish) ||
     (pSVar31 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver, pSVar31->theRep == ROW)) goto LAB_00488890;
  local_6f0 = (cpp_dec_float<100U,_int,_void> *)
              &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).field_0x174;
  if (*(int *)&this->field_0x1bc != 2) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (local_6f0,&lowstab.m_backend);
    if (iVar21 < 1) goto LAB_00488890;
    pSVar31 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .thesolver;
  }
  pUVar36 = pSVar31->theCoPvec;
  pUVar6 = pSVar31->thePvec;
  local_6e0 = (pUVar6->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_700 = (pUVar6->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx = (pUVar6->thedelta).super_IdxSet.idx;
  iVar21 = (pUVar6->thedelta).super_IdxSet.num;
  local_710 = (pSVar31->theLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6e8 = (pSVar31->theUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6d0 = (pUVar36->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6f8 = (pUVar36->thedelta).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  idx_00 = (pUVar36->thedelta).super_IdxSet.idx;
  iVar24 = (pUVar36->thedelta).super_IdxSet.num;
  local_708 = (pSVar31->theCoLbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_6d8 = (pSVar31->theCoUbound->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_458 = 0;
  uStack_450 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_628.fpclass = cpp_dec_float_finite;
  local_628.prec_elem = 0x10;
  local_628.data._M_elems[0] = 0;
  local_628.data._M_elems[1] = 0;
  local_628.data._M_elems[2] = 0;
  local_628.data._M_elems[3] = 0;
  local_628.data._M_elems[4] = 0;
  local_628.data._M_elems[5] = 0;
  local_628.data._M_elems[6] = 0;
  local_628.data._M_elems[7] = 0;
  local_628.data._M_elems[8] = 0;
  local_628.data._M_elems[9] = 0;
  local_628.data._M_elems[10] = 0;
  local_628.data._M_elems[0xb] = 0;
  local_628.data._M_elems[0xc] = 0;
  local_628.data._M_elems[0xd] = 0;
  local_628.data._M_elems._56_5_ = 0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_628.data._M_elems[0xf]._1_3_ = 0;
  local_628.exp = 0;
  local_628.neg = false;
  local_4d8.fpclass = cpp_dec_float_finite;
  local_4d8.prec_elem = 0x10;
  local_4d8.data._M_elems[0] = 0;
  local_4d8.data._M_elems[1] = 0;
  local_4d8.data._M_elems[2] = 0;
  local_4d8.data._M_elems[3] = 0;
  local_4d8.data._M_elems[4] = 0;
  local_4d8.data._M_elems[5] = 0;
  local_4d8.data._M_elems[6] = 0;
  local_4d8.data._M_elems[7] = 0;
  local_4d8.data._M_elems[8] = 0;
  local_4d8.data._M_elems[9] = 0;
  local_4d8.data._M_elems[10] = 0;
  local_4d8.data._M_elems[0xb] = 0;
  local_4d8.data._M_elems[0xc] = 0;
  local_4d8.data._M_elems[0xd] = 0;
  local_4d8.data._M_elems._56_5_ = 0;
  local_4d8.data._M_elems[0xf]._1_3_ = 0;
  local_4d8.exp = 0;
  local_4d8.neg = false;
  stab.m_backend.fpclass = cpp_dec_float_finite;
  stab.m_backend.prec_elem = 0x10;
  stab.m_backend.data._M_elems[0] = 0;
  stab.m_backend.data._M_elems[1] = 0;
  stab.m_backend.data._M_elems[2] = 0;
  stab.m_backend.data._M_elems[3] = 0;
  stab.m_backend.data._M_elems[4] = 0;
  stab.m_backend.data._M_elems[5] = 0;
  stab.m_backend.data._M_elems[6] = 0;
  stab.m_backend.data._M_elems[7] = 0;
  stab.m_backend.data._M_elems[8] = 0;
  stab.m_backend.data._M_elems[9] = 0;
  stab.m_backend.data._M_elems[10] = 0;
  stab.m_backend.data._M_elems[0xb] = 0;
  stab.m_backend.data._M_elems[0xc] = 0;
  stab.m_backend.data._M_elems[0xd] = 0;
  stab.m_backend.data._M_elems._56_5_ = 0;
  stab.m_backend.data._M_elems[0xf]._1_3_ = 0;
  stab.m_backend.exp = 0;
  stab.m_backend.neg = false;
  local_6c8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
  local_6c8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_6c8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  local_6c8.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_6c8.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_6c8.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
  local_6c8.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
  local_6c8.data._M_elems._56_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
  local_6c8.exp = (val->m_backend).exp;
  local_6c8.neg = (val->m_backend).neg;
  local_6c8.fpclass = (val->m_backend).fpclass;
  local_6c8.prec_elem = (val->m_backend).prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)val,0.0);
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_628,0.0);
  nBp = 0;
  minIdx = -1;
  if (local_6c8.fpclass == cpp_dec_float_NaN) {
LAB_004888a7:
    collectBreakpointsMin(this,&nBp,&minIdx,idx,iVar21,local_700,local_6e0,local_6e8,local_710,PVEC)
    ;
    collectBreakpointsMin
              (this,&nBp,&minIdx,idx_00,iVar24,local_6f8,local_6d0,local_6d8,local_708,COPVEC);
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_6c8,&lowstab.m_backend);
    if (iVar22 < 1) goto LAB_004888a7;
    collectBreakpointsMax(this,&nBp,&minIdx,idx,iVar21,local_700,local_6e0,local_6e8,local_710,PVEC)
    ;
    collectBreakpointsMax
              (this,&nBp,&minIdx,idx_00,iVar24,local_6f8,local_6d0,local_6d8,local_708,COPVEC);
  }
  if (nBp == 0) {
    *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_6c8.data._M_elems._48_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_6c8.data._M_elems._56_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_6c8.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_6c8.data._M_elems._40_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_6c8.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_6c8.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_6c8.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_6c8.data._M_elems._8_8_;
    (val->m_backend).exp = local_6c8.exp;
    (val->m_backend).neg = local_6c8.neg;
    (val->m_backend).fpclass = local_6c8.fpclass;
    (val->m_backend).prec_elem = local_6c8.prec_elem;
    uVar32._0_4_ = enterId.super_DataKey.info;
    uVar32._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar32;
  }
  lVar29 = (long)minIdx;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_488 = *(undefined8 *)&pBVar7[lVar29].val;
  uStack_480 = *(undefined8 *)((long)&pBVar7[lVar29].val + 8);
  local_478 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x10);
  uStack_470 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x18);
  local_468 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x20);
  uStack_460 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x28);
  local_458 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x30);
  uStack_450 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x38);
  iVar21 = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x40);
  bVar44 = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x44);
  iVar24 = pBVar7[lVar29].idx;
  BVar15 = pBVar7[lVar29].src;
  uVar32 = *(undefined8 *)&(pBVar7->val).m_backend;
  uVar28 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 8);
  uVar10 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x10);
  uVar11 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x18);
  uVar12 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x20);
  uVar27 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x28);
  uVar26 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x38);
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x30) =
       *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x30);
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x38) = uVar26;
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x20) = uVar12;
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x28) = uVar27;
  *(undefined8 *)&pBVar7[lVar29].val = uVar32;
  *(undefined8 *)((long)&pBVar7[lVar29].val + 8) = uVar28;
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x10) = uVar10;
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x18) = uVar11;
  *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x40) =
       *(int *)((long)&(pBVar7->val).m_backend + 0x40);
  *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x44) =
       *(bool *)((long)&(pBVar7->val).m_backend + 0x44);
  uVar32 = *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x48);
  BVar14 = pBVar7->src;
  pBVar7[lVar29].idx = pBVar7->idx;
  pBVar7[lVar29].src = BVar14;
  uVar28 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x48);
  *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x48) = uVar32;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x30) = local_458;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x38) = uStack_450;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x20) = local_468;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x28) = uStack_460;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x10) = local_478;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x18) = uStack_470;
  *(undefined8 *)&(pBVar7->val).m_backend = local_488;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 8) = uStack_480;
  *(int *)((long)&(pBVar7->val).m_backend + 0x40) = iVar21;
  *(bool *)((long)&(pBVar7->val).m_backend + 0x44) = bVar44;
  *(undefined8 *)((long)&(pBVar7->val).m_backend + 0x48) = uVar28;
  pBVar7->idx = iVar24;
  pBVar7->src = BVar15;
  pnVar37 = (((this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .thesolver)->theCoTest).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4d8.data._M_elems[0] = pnVar37[leaveIdx].m_backend.data._M_elems[0];
  puVar33 = (uint *)((long)&pnVar37[leaveIdx].m_backend.data + 0x30);
  uVar32 = *(undefined8 *)(puVar33 + 2);
  lowstab.m_backend.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)puVar33 >> 0x20);
  lowstab.m_backend.data._M_elems[0xd] = (uint)uVar32;
  lowstab.m_backend.data._M_elems[0xe] = (uint)((ulong)uVar32 >> 0x20);
  puVar33 = (uint *)((long)&pnVar37[leaveIdx].m_backend.data + 0x24);
  lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar33;
  uVar28 = *(undefined8 *)(puVar33 + 2);
  lowstab.m_backend.data._M_elems[10] = (uint)uVar28;
  lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar28 >> 0x20);
  puVar33 = (uint *)((long)&pnVar37[leaveIdx].m_backend.data + 0x14);
  lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar33;
  puVar1 = (uint *)((long)&pnVar37[leaveIdx].m_backend.data + 4);
  lowstab.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar1;
  local_4d8.exp = pnVar37[leaveIdx].m_backend.exp;
  local_4d8.neg = pnVar37[leaveIdx].m_backend.neg;
  local_4d8.fpclass = pnVar37[leaveIdx].m_backend.fpclass;
  local_4d8.prec_elem = pnVar37[leaveIdx].m_backend.prec_elem;
  if (local_4d8.neg == true) {
    local_4d8.neg = local_4d8.fpclass == cpp_dec_float_finite && local_4d8.data._M_elems[0] == 0;
  }
  local_4d8.data._M_elems[1] = (uint)*(undefined8 *)puVar1;
  local_4d8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
  local_4d8.data._M_elems[3] = (uint)*(undefined8 *)(puVar1 + 2);
  local_4d8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar1 + 2) >> 0x20);
  local_4d8.data._M_elems[5] = (uint)*(undefined8 *)puVar33;
  local_4d8.data._M_elems[6] = (uint)((ulong)*(undefined8 *)puVar33 >> 0x20);
  local_4d8.data._M_elems[7] = (uint)*(undefined8 *)(puVar33 + 2);
  local_4d8.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(puVar33 + 2) >> 0x20);
  local_4d8.data._M_elems[9] = lowstab.m_backend.data._M_elems[8];
  local_4d8.data._M_elems[10] = lowstab.m_backend.data._M_elems[9];
  local_4d8.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xb];
  local_4d8.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xc];
  local_4d8.data._M_elems._56_5_ = SUB85(uVar32,0);
  local_4d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar32 >> 0x28);
  fVar23 = cpp_dec_float_NaN;
  local_4d8.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[10];
  if (local_4d8.fpclass != cpp_dec_float_NaN) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&lowstab.m_backend,0,(type *)0x0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_4d8,&lowstab.m_backend);
    if (iVar21 == 0) {
      pSVar31 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver;
      local_4d8.data._M_elems[0] = (pSVar31->instableLeaveVal).m_backend.data._M_elems[0];
      local_4d8.exp = (pSVar31->instableLeaveVal).m_backend.exp;
      local_4d8.neg = (pSVar31->instableLeaveVal).m_backend.neg;
      local_4d8.fpclass = (pSVar31->instableLeaveVal).m_backend.fpclass;
      local_4d8.prec_elem = (pSVar31->instableLeaveVal).m_backend.prec_elem;
      if (local_4d8.neg == true) {
        local_4d8.neg = local_4d8.fpclass == cpp_dec_float_finite && local_4d8.data._M_elems[0] == 0
        ;
      }
      uVar32 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 1);
      uVar28 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 3);
      uVar10 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 5);
      uVar11 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 7);
      uVar12 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 9);
      uVar27 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 0xb);
      uVar26 = *(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 0xe);
      local_4d8.data._M_elems[0xd] =
           (uint)((ulong)*(undefined8 *)((pSVar31->instableLeaveVal).m_backend.data._M_elems + 0xc)
                 >> 0x20);
      local_4d8.data._M_elems._56_5_ = SUB85(uVar26,0);
      local_4d8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar26 >> 0x28);
      local_4d8.data._M_elems[9] = (uint)uVar12;
      local_4d8.data._M_elems[10] = (uint)((ulong)uVar12 >> 0x20);
      local_4d8.data._M_elems[0xb] = (uint)uVar27;
      local_4d8.data._M_elems[0xc] = (uint)((ulong)uVar27 >> 0x20);
      local_4d8.data._M_elems[5] = (uint)uVar10;
      local_4d8.data._M_elems[6] = (uint)((ulong)uVar10 >> 0x20);
      local_4d8.data._M_elems[7] = (uint)uVar11;
      local_4d8.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
      local_4d8.data._M_elems[1] = (uint)uVar32;
      local_4d8.data._M_elems[2] = (uint)((ulong)uVar32 >> 0x20);
      local_4d8.data._M_elems[3] = (uint)uVar28;
      local_4d8.data._M_elems[4] = (uint)((ulong)uVar28 >> 0x20);
      fVar23 = local_4d8.fpclass;
    }
    else {
      fVar23 = local_4d8.fpclass;
    }
  }
  local_4e0.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_83c = 0;
  uVar42 = 0;
  if (nBp < 1) {
    iVar21 = 0;
  }
  else {
    iVar21 = 0;
    uVar42 = 0;
    if (fVar23 != cpp_dec_float_NaN) {
      lVar29 = 0x50;
      iVar21 = 0;
      while( true ) {
        uVar42 = local_83c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&lowstab.m_backend,0,(type *)0x0);
        iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_4d8,&lowstab.m_backend);
        if (iVar24 < 1) break;
        if (iVar21 < (int)uVar42) {
          iVar21 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                             ((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_4e0,iVar21 + 1,nBp,4,
                              0,0,true);
        }
        pSVar31 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .thesolver;
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar24 = *(int *)((long)&(pBVar7->val).m_backend + lVar29);
        if (*(int *)((long)&(pBVar7->val).m_backend + lVar29 + 4) == 0) {
          if (0 < pSVar31->theRep *
                  ((pSVar31->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.stat)->data[iVar24]) {
            *(undefined4 *)((long)&(pBVar7->val).m_backend + lVar29) = 0xffffffff;
            pUVar36 = pSVar31->thePvec;
            goto LAB_00488cf5;
          }
          lowstab.m_backend.exp = local_700[iVar24].m_backend.exp;
          lowstab.m_backend.neg = local_700[iVar24].m_backend.neg;
          lowstab.m_backend.fpclass = local_700[iVar24].m_backend.fpclass;
          lowstab.m_backend.prec_elem = local_700[iVar24].m_backend.prec_elem;
          lowstab.m_backend.data._M_elems._16_16_ =
               *(undefined1 (*) [16])(local_700[iVar24].m_backend.data._M_elems + 4);
          puVar33 = local_700[iVar24].m_backend.data._M_elems + 8;
          lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar33;
          uVar32 = *(undefined8 *)(puVar33 + 2);
          puVar33 = local_700[iVar24].m_backend.data._M_elems + 0xc;
          uVar28 = *(undefined8 *)puVar33;
          uVar10 = *(undefined8 *)(puVar33 + 2);
          lowstab.m_backend.data._M_elems[0xc] = (uint)uVar28;
          lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)uVar28 >> 0x20);
          lowstab.m_backend.data._M_elems[0xe] = (uint)uVar10;
          lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
          lowstab.m_backend.data._M_elems[10] = (uint)uVar32;
          lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar32 >> 0x20);
          if ((lowstab.m_backend.neg == true) &&
             (lowstab.m_backend.data._M_elems[0] =
                   (uint)*(undefined8 *)local_700[iVar24].m_backend.data._M_elems,
             lowstab.m_backend.fpclass != cpp_dec_float_finite ||
             lowstab.m_backend.data._M_elems[0] != 0)) {
            lowstab.m_backend.neg = false;
          }
          pnVar37 = (pSVar31->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar24;
          local_630._0_4_ = cpp_dec_float_finite;
          local_630._4_4_ = 0x10;
          local_678 = (undefined1  [16])0x0;
          local_668 = (undefined1  [16])0x0;
          local_658 = (undefined1  [16])0x0;
          local_648[0] = 0;
          local_648[1] = 0;
          stack0xfffffffffffff9c0 = 0;
          uStack_63b = 0;
          iStack_638 = 0;
          bStack_634 = false;
          if ((pointer)local_678 != pnVar37) {
            local_678 = *(undefined1 (*) [16])&(pnVar37->m_backend).data;
            local_668 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x10);
            local_658 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x20);
            local_648._0_8_ = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x30);
            uVar32 = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x38);
            stack0xfffffffffffff9c0 = (undefined5)uVar32;
            uStack_63b = (undefined3)((ulong)uVar32 >> 0x28);
            iStack_638 = (pnVar37->m_backend).exp;
            bStack_634 = (pnVar37->m_backend).neg;
            local_630._0_4_ = (pnVar37->m_backend).fpclass;
            local_630._4_4_ = (pnVar37->m_backend).prec_elem;
          }
          lowstab.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])local_700[iVar24].m_backend.data._M_elems;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_678,&lowstab.m_backend);
          pnVar37 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar24;
          local_720._0_4_ = cpp_dec_float_finite;
          local_720._4_4_ = 0x10;
          local_768 = (undefined1  [16])0x0;
          local_758 = (undefined1  [16])0x0;
          local_748 = (undefined1  [16])0x0;
          local_738[0] = 0;
          local_738[1] = 0;
          stack0xfffffffffffff8d0 = 0;
          uStack_72b = 0;
          iStack_728 = 0;
          bStack_724 = false;
          if ((pointer)local_768 != pnVar37) {
            local_768 = *(undefined1 (*) [16])&(pnVar37->m_backend).data;
            local_758 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x10);
            local_748 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x20);
            local_738._0_8_ = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x30);
            uVar32 = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x38);
            stack0xfffffffffffff8d0 = (undefined5)uVar32;
            uStack_72b = (undefined3)((ulong)uVar32 >> 0x28);
            iStack_728 = (pnVar37->m_backend).exp;
            bStack_724 = (pnVar37->m_backend).neg;
            local_720._0_4_ = (pnVar37->m_backend).fpclass;
            local_720._4_4_ = (pnVar37->m_backend).prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_768,&lowstab.m_backend);
          result_1.m_backend.data._M_elems[0] = local_678._0_4_;
          result_1.m_backend.data._M_elems[1] = local_678._4_4_;
          result_1.m_backend.data._M_elems[2] = local_678._8_4_;
          result_1.m_backend.data._M_elems[3] = local_678._12_4_;
          result_1.m_backend.data._M_elems[4] = local_668._0_4_;
          result_1.m_backend.data._M_elems[5] = local_668._4_4_;
          result_1.m_backend.data._M_elems[6] = local_668._8_4_;
          result_1.m_backend.data._M_elems[7] = local_668._12_4_;
          result_1.m_backend.data._M_elems[8] = local_658._0_4_;
          result_1.m_backend.data._M_elems[9] = local_658._4_4_;
          result_1.m_backend.data._M_elems[10] = local_658._8_4_;
          result_1.m_backend.data._M_elems[0xb] = local_658._12_4_;
          result_1.m_backend.data._M_elems[0xc] = local_648[0];
          result_1.m_backend.data._M_elems[0xd] = local_648[1];
          result_1.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff9c0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = uStack_63b;
          result_1.m_backend.exp = iStack_638;
          result_1.m_backend.neg = bStack_634;
          result_1.m_backend.fpclass = (fpclass_type)local_630;
          result_1.m_backend.prec_elem = local_630._4_4_;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_768);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_4d8,&result_1.m_backend);
          if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
            goto joined_r0x00489268;
          }
        }
        else if (pSVar31->theRep *
                 ((pSVar31->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat)->data[iVar24] < 1) {
          lowstab.m_backend.exp = local_6f8[iVar24].m_backend.exp;
          lowstab.m_backend.neg = local_6f8[iVar24].m_backend.neg;
          lowstab.m_backend.fpclass = local_6f8[iVar24].m_backend.fpclass;
          lowstab.m_backend.prec_elem = local_6f8[iVar24].m_backend.prec_elem;
          lowstab.m_backend.data._M_elems._16_16_ =
               *(undefined1 (*) [16])(local_6f8[iVar24].m_backend.data._M_elems + 4);
          puVar33 = local_6f8[iVar24].m_backend.data._M_elems + 8;
          lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar33;
          uVar32 = *(undefined8 *)(puVar33 + 2);
          puVar33 = local_6f8[iVar24].m_backend.data._M_elems + 0xc;
          uVar28 = *(undefined8 *)puVar33;
          uVar10 = *(undefined8 *)(puVar33 + 2);
          lowstab.m_backend.data._M_elems[0xc] = (uint)uVar28;
          lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)uVar28 >> 0x20);
          lowstab.m_backend.data._M_elems[0xe] = (uint)uVar10;
          lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
          lowstab.m_backend.data._M_elems[10] = (uint)uVar32;
          lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar32 >> 0x20);
          if ((lowstab.m_backend.neg == true) &&
             (lowstab.m_backend.data._M_elems[0] =
                   (uint)*(undefined8 *)local_6f8[iVar24].m_backend.data._M_elems,
             lowstab.m_backend.fpclass != cpp_dec_float_finite ||
             lowstab.m_backend.data._M_elems[0] != 0)) {
            lowstab.m_backend.neg = false;
          }
          pnVar37 = (pSVar31->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar24;
          local_630._0_4_ = cpp_dec_float_finite;
          local_630._4_4_ = 0x10;
          local_678 = (undefined1  [16])0x0;
          local_668 = (undefined1  [16])0x0;
          local_658 = (undefined1  [16])0x0;
          local_648[0] = 0;
          local_648[1] = 0;
          stack0xfffffffffffff9c0 = 0;
          uStack_63b = 0;
          iStack_638 = 0;
          bStack_634 = false;
          if ((pointer)local_678 != pnVar37) {
            local_678 = *(undefined1 (*) [16])&(pnVar37->m_backend).data;
            local_668 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x10);
            local_658 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x20);
            local_648._0_8_ = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x30);
            uVar32 = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x38);
            stack0xfffffffffffff9c0 = (undefined5)uVar32;
            uStack_63b = (undefined3)((ulong)uVar32 >> 0x28);
            iStack_638 = (pnVar37->m_backend).exp;
            bStack_634 = (pnVar37->m_backend).neg;
            local_630._0_4_ = (pnVar37->m_backend).fpclass;
            local_630._4_4_ = (pnVar37->m_backend).prec_elem;
          }
          lowstab.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])local_6f8[iVar24].m_backend.data._M_elems;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_678,&lowstab.m_backend);
          pnVar37 = (((this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver)->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar24;
          local_720._0_4_ = cpp_dec_float_finite;
          local_720._4_4_ = 0x10;
          local_768 = (undefined1  [16])0x0;
          local_758 = (undefined1  [16])0x0;
          local_748 = (undefined1  [16])0x0;
          local_738[0] = 0;
          local_738[1] = 0;
          stack0xfffffffffffff8d0 = 0;
          uStack_72b = 0;
          iStack_728 = 0;
          bStack_724 = false;
          if ((pointer)local_768 != pnVar37) {
            local_768 = *(undefined1 (*) [16])&(pnVar37->m_backend).data;
            local_758 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x10);
            local_748 = *(undefined1 (*) [16])((long)&(pnVar37->m_backend).data + 0x20);
            local_738._0_8_ = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x30);
            uVar32 = *(undefined8 *)((long)&(pnVar37->m_backend).data + 0x38);
            stack0xfffffffffffff8d0 = (undefined5)uVar32;
            uStack_72b = (undefined3)((ulong)uVar32 >> 0x28);
            iStack_728 = (pnVar37->m_backend).exp;
            bStack_724 = (pnVar37->m_backend).neg;
            local_720._0_4_ = (pnVar37->m_backend).fpclass;
            local_720._4_4_ = (pnVar37->m_backend).prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    ((cpp_dec_float<100U,_int,_void> *)local_768,&lowstab.m_backend);
          result_1.m_backend.data._M_elems[0] = local_678._0_4_;
          result_1.m_backend.data._M_elems[1] = local_678._4_4_;
          result_1.m_backend.data._M_elems[2] = local_678._8_4_;
          result_1.m_backend.data._M_elems[3] = local_678._12_4_;
          result_1.m_backend.data._M_elems[4] = local_668._0_4_;
          result_1.m_backend.data._M_elems[5] = local_668._4_4_;
          result_1.m_backend.data._M_elems[6] = local_668._8_4_;
          result_1.m_backend.data._M_elems[7] = local_668._12_4_;
          result_1.m_backend.data._M_elems[8] = local_658._0_4_;
          result_1.m_backend.data._M_elems[9] = local_658._4_4_;
          result_1.m_backend.data._M_elems[10] = local_658._8_4_;
          result_1.m_backend.data._M_elems[0xb] = local_658._12_4_;
          result_1.m_backend.data._M_elems[0xc] = local_648[0];
          result_1.m_backend.data._M_elems[0xd] = local_648[1];
          result_1.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff9c0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = uStack_63b;
          result_1.m_backend.exp = iStack_638;
          result_1.m_backend.neg = bStack_634;
          result_1.m_backend.fpclass = (fpclass_type)local_630;
          result_1.m_backend.prec_elem = local_630._4_4_;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_768);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (&local_4d8,&result_1.m_backend);
          if (lowstab.m_backend.fpclass != cpp_dec_float_NaN) {
joined_r0x00489268:
            if ((local_628.fpclass != cpp_dec_float_NaN) &&
               (iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&lowstab.m_backend,&local_628), 0 < iVar24)) {
              local_628.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
              local_628.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
              local_628.data._M_elems._56_5_ =
                   SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],
                                  lowstab.m_backend.data._M_elems[0xe]),0);
              local_628.data._M_elems[0xf]._1_3_ =
                   (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
              local_628.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
              local_628.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
              local_628.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
              local_628.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
              local_628.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
              local_628.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
              local_628.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
              local_628.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
              local_628.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
              local_628.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
              local_628.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
              local_628.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
              local_628.exp = lowstab.m_backend.exp;
              local_628.neg = lowstab.m_backend.neg;
              local_628.fpclass = lowstab.m_backend.fpclass;
              local_628.prec_elem = lowstab.m_backend.prec_elem;
            }
          }
        }
        else {
          *(undefined4 *)((long)&(pBVar7->val).m_backend + lVar29) = 0xffffffff;
          pUVar36 = pSVar31->theCoPvec;
LAB_00488cf5:
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearIdx(&pUVar36->thedelta,iVar24);
        }
        uVar42 = uVar42 + 1;
        fVar23 = local_4d8.fpclass;
        if ((nBp <= (int)uVar42) ||
           (lVar29 = lVar29 + 0x58, local_83c = uVar42, local_4d8.fpclass == cpp_dec_float_NaN))
        goto LAB_004892f0;
      }
      fVar23 = local_4d8.fpclass;
    }
  }
LAB_004892f0:
  uVar40 = uVar42 - 1;
  uVar45 = (ulong)uVar40;
  local_848 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta;
  local_83c = uVar40;
  if ((fVar23 != cpp_dec_float_NaN) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       .delta.m_backend.fpclass != cpp_dec_float_NaN &&
      (iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&local_4d8,&local_848->m_backend), nBp <= (int)uVar42 && 0 < iVar24)))) {
    lowstab.m_backend.fpclass = cpp_dec_float_finite;
    lowstab.m_backend.prec_elem = 0x10;
    lowstab.m_backend.data._M_elems[0] = 0;
    lowstab.m_backend.data._M_elems[1] = 0;
    lowstab.m_backend.data._M_elems[2] = 0;
    lowstab.m_backend.data._M_elems[3] = 0;
    lowstab.m_backend.data._M_elems[4] = 0;
    lowstab.m_backend.data._M_elems[5] = 0;
    lowstab.m_backend.data._M_elems[6] = 0;
    lowstab.m_backend.data._M_elems[7] = 0;
    lowstab.m_backend.data._M_elems[8] = 0;
    lowstab.m_backend.data._M_elems[9] = 0;
    lowstab.m_backend.data._M_elems[10] = 0;
    lowstab.m_backend.data._M_elems[0xb] = 0;
    lowstab.m_backend.data._M_elems[0xc] = 0;
    lowstab.m_backend.data._M_elems[0xd] = 0;
    lowstab.m_backend.data._M_elems[0xe] = 0;
    lowstab.m_backend.data._M_elems[0xf] = 0;
    lowstab.m_backend.exp = 0;
    lowstab.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (local_6f0,&lowstab.m_backend);
    *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_6c8.data._M_elems._48_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_6c8.data._M_elems._56_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_6c8.data._M_elems._32_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_6c8.data._M_elems._40_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_6c8.data._M_elems._16_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_6c8.data._M_elems._24_8_;
    *(undefined8 *)(val->m_backend).data._M_elems = local_6c8.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_6c8.data._M_elems._8_8_;
    (val->m_backend).exp = local_6c8.exp;
    (val->m_backend).neg = local_6c8.neg;
    (val->m_backend).fpclass = local_6c8.fpclass;
    (val->m_backend).prec_elem = local_6c8.prec_elem;
    polish = false;
LAB_00488890:
    DVar25 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::selectEnter(&this->
                                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ,val,leaveIdx,polish);
    uVar28._0_4_ = DVar25.info;
    uVar28._4_4_ = DVar25.idx;
    return (SPxId)uVar28;
  }
  lVar29 = (long)(int)uVar40;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_678 = *(undefined1 (*) [16])&pBVar7[lVar29].val.m_backend;
  local_668 = *(undefined1 (*) [16])((long)&pBVar7[lVar29].val.m_backend + 0x10);
  local_658 = *(undefined1 (*) [16])((long)&pBVar7[lVar29].val.m_backend + 0x20);
  puVar33 = (uint *)((long)&pBVar7[lVar29].val.m_backend + 0x30);
  local_648._0_8_ = *(undefined8 *)puVar33;
  uVar32 = *(undefined8 *)(puVar33 + 2);
  stack0xfffffffffffff9c0 = (undefined5)uVar32;
  uStack_63b = (undefined3)((ulong)uVar32 >> 0x28);
  iStack_638 = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x40);
  bStack_634 = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x44);
  local_630 = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x48);
  uVar40 = 0xffffffff;
  if ((int)uVar42 < nBp) {
    uVar41 = lVar29 + 1;
    do {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<100U,_int,_void> *)local_768,0,(type *)0x0);
      if (iVar21 <= (int)uVar45) {
        iVar21 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                           ((this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&local_4e0,iVar21 + 1,nBp,4,0,
                            0,true);
      }
      pSVar31 = (this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver;
      pBVar7 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar24 = pBVar7[uVar41].idx;
      if (pBVar7[uVar41].src == PVEC) {
        if (0 < pSVar31->theRep *
                ((pSVar31->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.stat)->data[iVar24]) {
          pBVar7[uVar41].idx = -1;
          pUVar36 = pSVar31->thePvec;
          goto LAB_0048952d;
        }
        pnVar38 = local_700 + iVar24;
        x_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar38->m_backend).data._M_elems;
        x_1.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pnVar38->m_backend).data._M_elems + 2);
        puVar33 = local_700[iVar24].m_backend.data._M_elems + 4;
        x_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar33;
        x_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar33 + 2);
        lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar33;
        puVar33 = local_700[iVar24].m_backend.data._M_elems + 8;
        lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar33;
        x_1.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar33 + 2);
        puVar33 = local_700[iVar24].m_backend.data._M_elems + 0xc;
        x_1.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar33;
        uVar32 = *(undefined8 *)(puVar33 + 2);
        x_1.m_backend.data._M_elems._56_5_ = SUB85(uVar32,0);
        x_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar32 >> 0x28);
        lowstab.m_backend.exp = local_700[iVar24].m_backend.exp;
        x_1.m_backend.neg = local_700[iVar24].m_backend.neg;
        x_1.m_backend.fpclass = local_700[iVar24].m_backend.fpclass;
        x_1.m_backend.prec_elem = local_700[iVar24].m_backend.prec_elem;
        lowstab.m_backend.data._M_elems[0xc] = x_1.m_backend.data._M_elems[0xc];
        lowstab.m_backend.data._M_elems[0xd] = x_1.m_backend.data._M_elems[0xd];
        lowstab.m_backend.data._M_elems[0xe] = (uint)uVar32;
        lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar32 >> 0x20);
        lowstab.m_backend.data._M_elems[10] = x_1.m_backend.data._M_elems[10];
        lowstab.m_backend.data._M_elems[0xb] = x_1.m_backend.data._M_elems[0xb];
        lowstab.m_backend.prec_elem = x_1.m_backend.prec_elem;
        lowstab.m_backend.fpclass = x_1.m_backend.fpclass;
        lowstab.m_backend.neg = x_1.m_backend.neg;
        if ((x_1.m_backend.neg == true) &&
           (lowstab.m_backend.data._M_elems[0] = x_1.m_backend.data._M_elems[0],
           lowstab.m_backend.data._M_elems[0] != 0 || x_1.m_backend.fpclass != cpp_dec_float_finite)
           ) {
          lowstab.m_backend.neg = false;
        }
        x_1.m_backend.data._M_elems._32_8_ = lowstab.m_backend.data._M_elems._32_8_;
        x_1.m_backend.exp = lowstab.m_backend.exp;
        if (((x_1.m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_628.fpclass != cpp_dec_float_NaN)) &&
           (lowstab.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])(pnVar38->m_backend).data._M_elems,
           iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&lowstab.m_backend,&local_628), 0 < iVar22)) {
          pSVar31 = (this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .thesolver;
          pIVar8 = (pSVar31->thevectors->set).theitem;
          iVar22 = (pSVar31->thevectors->set).thekey[iVar24].idx;
          pUVar36 = pSVar31->theCoPvec;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x10;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          iVar4 = pIVar8[iVar22].data.
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused;
          local_718 = uVar41;
          if (0 < iVar4) {
            pNVar34 = pIVar8[iVar22].data.
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            uVar42 = iVar4 + 1;
            local_5d0 = this;
            do {
              pNVar30 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((pUVar36->
                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + pNVar34->idx);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems._56_5_ = 0;
              result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              v = pNVar34;
              if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&result_1 != pNVar30) &&
                 (v = pNVar30,
                 pNVar34 !=
                 (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&result_1)) {
                result_1.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pNVar34->val).m_backend.data._M_elems;
                result_1.m_backend.data._M_elems._16_16_ =
                     *(undefined1 (*) [16])((pNVar34->val).m_backend.data._M_elems + 4);
                result_1.m_backend.data._M_elems._32_16_ =
                     *(undefined1 (*) [16])((pNVar34->val).m_backend.data._M_elems + 8);
                result_1.m_backend.data._M_elems._48_8_ =
                     *(undefined8 *)((pNVar34->val).m_backend.data._M_elems + 0xc);
                uVar32 = *(undefined8 *)((pNVar34->val).m_backend.data._M_elems + 0xe);
                result_1.m_backend.data._M_elems._56_5_ = SUB85(uVar32,0);
                result_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar32 >> 0x28);
                result_1.m_backend.exp = (pNVar34->val).m_backend.exp;
                result_1.m_backend.neg = (pNVar34->val).m_backend.neg;
                result_1.m_backend.fpclass = (pNVar34->val).m_backend.fpclass;
                result_1.m_backend.prec_elem = (pNVar34->val).m_backend.prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                        ((cpp_dec_float<100U,_int,_void> *)&result_1,
                         (cpp_dec_float<100U,_int,_void> *)v);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (&lowstab.m_backend,(cpp_dec_float<100U,_int,_void> *)&result_1);
              pNVar34 = pNVar34 + 1;
              uVar42 = uVar42 - 1;
            } while (1 < uVar42);
            pSVar31 = (local_5d0->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .thesolver;
            this = local_5d0;
          }
          uVar32 = lowstab.m_backend.data._M_elems._0_8_;
          uVar28 = lowstab.m_backend.data._M_elems._8_8_;
          uVar10 = lowstab.m_backend.data._M_elems._16_8_;
          uVar11 = lowstab.m_backend.data._M_elems._24_8_;
          result_1.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
          result_1.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
          result_1.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
          result_1.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
          result_1.m_backend.data._M_elems._56_5_ =
               SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],
                              lowstab.m_backend.data._M_elems[0xe]),0);
          result_1.m_backend.data._M_elems[0xf]._1_3_ =
               (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
          result_1.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
          result_1.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
          result_1.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
          result_1.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
          result_1.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
          result_1.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
          result_1.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
          result_1.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
          result_1.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
          result_1.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
          pnVar37 = (pSVar31->thePvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x30) = result_1.m_backend.data._M_elems._48_8_
          ;
          *(ulong *)((long)(pnVar37 + iVar24) + 0x38) =
               CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]);
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x20) = lowstab.m_backend.data._M_elems._32_8_;
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x28) = result_1.m_backend.data._M_elems._40_8_
          ;
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x10) = uVar10;
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x18) = uVar11;
          *(undefined8 *)&pnVar37[iVar24].m_backend = uVar32;
          *(undefined8 *)((long)&pnVar37[iVar24].m_backend + 8) = uVar28;
          *(int *)((long)(pnVar37 + iVar24) + 0x40) = lowstab.m_backend.exp;
          *(bool *)((long)(pnVar37 + iVar24) + 0x44) = lowstab.m_backend.neg;
          *(undefined8 *)((long)(pnVar37 + iVar24) + 0x48) = lowstab.m_backend._72_8_;
          pnVar37 = local_710;
          if (x_1.m_backend.fpclass != cpp_dec_float_NaN) {
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x10;
            lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                      ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.0);
            iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&x_1.m_backend,&lowstab.m_backend);
            pnVar37 = local_710;
            if (0 < iVar22) {
              pnVar37 = local_6e8;
            }
          }
          uVar41 = local_718;
          local_768 = *(undefined1 (*) [16])pnVar37[iVar24].m_backend.data._M_elems;
          puVar33 = pnVar37[iVar24].m_backend.data._M_elems + 4;
          local_758 = *(undefined1 (*) [16])puVar33;
          puVar1 = pnVar37[iVar24].m_backend.data._M_elems + 8;
          local_748 = *(undefined1 (*) [16])puVar1;
          puVar2 = pnVar37[iVar24].m_backend.data._M_elems + 0xc;
          local_738._0_8_ = *(undefined8 *)puVar2;
          uVar32 = *(undefined8 *)(puVar2 + 2);
          stack0xfffffffffffff8d0 = (undefined5)uVar32;
          uStack_72b = (undefined3)((ulong)uVar32 >> 0x28);
          iStack_728 = pnVar37[iVar24].m_backend.exp;
          bStack_724 = pnVar37[iVar24].m_backend.neg;
          local_720._0_4_ = pnVar37[iVar24].m_backend.fpclass;
          local_720._4_4_ = pnVar37[iVar24].m_backend.prec_elem;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems._32_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == &local_6e0[iVar24].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_768);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            result_1.m_backend.prec_elem = local_720._4_4_;
            result_1.m_backend.fpclass = (fpclass_type)local_720;
            result_1.m_backend.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])pnVar37[iVar24].m_backend.data._M_elems;
            result_1.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar33;
            result_1.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])puVar1;
            result_1.m_backend.data._M_elems._48_8_ = local_738._0_8_;
            result_1.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff8d0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = uStack_72b;
            result_1.m_backend.exp = iStack_728;
            result_1.m_backend.neg = bStack_724;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (&result_1.m_backend,&local_6e0[iVar24].m_backend);
          }
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x10;
          lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&lowstab.m_backend,&result_1.m_backend,&x_1.m_backend);
          local_748._12_4_ = lowstab.m_backend.data._M_elems[0xb];
          local_748._8_4_ = lowstab.m_backend.data._M_elems[10];
          local_738[1] = lowstab.m_backend.data._M_elems[0xd];
          local_738[0] = lowstab.m_backend.data._M_elems[0xc];
          stack0xfffffffffffff8d0 =
               (undefined5)
               CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]);
          uStack_72b = (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
          local_748._0_4_ = lowstab.m_backend.data._M_elems[8];
          local_748._4_4_ = lowstab.m_backend.data._M_elems[9];
          local_758._0_4_ = lowstab.m_backend.data._M_elems[4];
          local_758._4_4_ = lowstab.m_backend.data._M_elems[5];
          local_758._8_4_ = lowstab.m_backend.data._M_elems[6];
          local_758._12_4_ = lowstab.m_backend.data._M_elems[7];
          local_768._0_4_ = lowstab.m_backend.data._M_elems[0];
          local_768._4_4_ = lowstab.m_backend.data._M_elems[1];
          local_768._8_4_ = lowstab.m_backend.data._M_elems[2];
          local_768._12_4_ = lowstab.m_backend.data._M_elems[3];
          iStack_728 = lowstab.m_backend.exp;
          bStack_724 = lowstab.m_backend.neg;
          local_720._0_4_ = lowstab.m_backend.fpclass;
          local_720._4_4_ = lowstab.m_backend.prec_elem;
          if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_630 != cpp_dec_float_NaN)) &&
             (iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 ((cpp_dec_float<100U,_int,_void> *)local_768,
                                  (cpp_dec_float<100U,_int,_void> *)local_678), iVar24 < 1)) {
            local_628.neg = x_1.m_backend.neg;
            if (x_1.m_backend.neg == true) {
              local_628.neg =
                   x_1.m_backend.fpclass == cpp_dec_float_finite &&
                   x_1.m_backend.data._M_elems[0] == 0;
            }
            local_628.data._M_elems[0] = x_1.m_backend.data._M_elems[0];
            pnVar38 = &x_1;
            local_628.exp = x_1.m_backend.exp;
            local_628._72_8_ = x_1.m_backend._72_8_;
            goto LAB_00489eb7;
          }
        }
LAB_00489efe:
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x10;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems[6] = 0;
        lowstab.m_backend.data._M_elems[7] = 0;
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        if (&lowstab != local_848) {
          lowstab.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])(local_848->m_backend).data._M_elems;
          lowstab.m_backend.data._M_elems._16_16_ =
               *(undefined1 (*) [16])((local_848->m_backend).data._M_elems + 4);
          lowstab.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((local_848->m_backend).data._M_elems + 8);
          uVar32 = *(undefined8 *)((local_848->m_backend).data._M_elems + 10);
          uVar28 = *(undefined8 *)((local_848->m_backend).data._M_elems + 0xc);
          uVar10 = *(undefined8 *)((local_848->m_backend).data._M_elems + 0xe);
          lowstab.m_backend.data._M_elems[0xc] = (uint)uVar28;
          lowstab.m_backend.data._M_elems[0xd] = (uint)((ulong)uVar28 >> 0x20);
          lowstab.m_backend.data._M_elems[0xe] = (uint)uVar10;
          lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar10 >> 0x20);
          lowstab.m_backend.data._M_elems[10] = (uint)uVar32;
          lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)uVar32 >> 0x20);
          lowstab.m_backend.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.exp;
          lowstab.m_backend.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.neg;
          lowstab.m_backend.fpclass =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.fpclass;
          lowstab.m_backend.prec_elem =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .delta.m_backend.prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&lowstab.m_backend,(cpp_dec_float<100U,_int,_void> *)local_678);
        if ((((fpclass_type)local_720 != cpp_dec_float_NaN) &&
            (lowstab.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_768,&lowstab.m_backend),
           0 < iVar24)) break;
      }
      else {
        if (pSVar31->theRep *
            ((pSVar31->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.costat)->data[iVar24] < 1) {
          pnVar38 = local_6f8 + iVar24;
          result_1.m_backend.data._M_elems._0_16_ =
               *(undefined1 (*) [16])(pnVar38->m_backend).data._M_elems;
          puVar33 = local_6f8[iVar24].m_backend.data._M_elems + 4;
          lowstab.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar33;
          result_1.m_backend.data._M_elems._16_16_ = *(undefined1 (*) [16])puVar33;
          puVar33 = local_6f8[iVar24].m_backend.data._M_elems + 8;
          lowstab.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar33;
          result_1.m_backend.data._M_elems._32_16_ = *(undefined1 (*) [16])puVar33;
          puVar1 = local_6f8[iVar24].m_backend.data._M_elems + 0xc;
          result_1.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
          uVar32 = *(undefined8 *)(puVar1 + 2);
          result_1.m_backend.data._M_elems._56_5_ = SUB85(uVar32,0);
          result_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar32 >> 0x28);
          lowstab.m_backend.exp = local_6f8[iVar24].m_backend.exp;
          result_1.m_backend.neg = local_6f8[iVar24].m_backend.neg;
          result_1.m_backend.fpclass = local_6f8[iVar24].m_backend.fpclass;
          result_1.m_backend.prec_elem = local_6f8[iVar24].m_backend.prec_elem;
          lowstab.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
          lowstab.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
          lowstab.m_backend.data._M_elems[0xe] = (uint)uVar32;
          lowstab.m_backend.data._M_elems[0xf] = (uint)((ulong)uVar32 >> 0x20);
          lowstab.m_backend.data._M_elems[10] = (uint)*(undefined8 *)(puVar33 + 2);
          lowstab.m_backend.data._M_elems[0xb] = (uint)((ulong)*(undefined8 *)(puVar33 + 2) >> 0x20)
          ;
          lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
          lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
          lowstab.m_backend.neg = result_1.m_backend.neg;
          if ((result_1.m_backend.neg == true) &&
             (lowstab.m_backend.data._M_elems[0] =
                   (uint)*(undefined8 *)(pnVar38->m_backend).data._M_elems,
             lowstab.m_backend.data._M_elems[0] != 0 ||
             result_1.m_backend.fpclass != cpp_dec_float_finite)) {
            lowstab.m_backend.neg = false;
          }
          result_1.m_backend.exp = lowstab.m_backend.exp;
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_628.fpclass != cpp_dec_float_NaN)) &&
             (lowstab.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pnVar38->m_backend).data._M_elems,
             iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (&lowstab.m_backend,&local_628), 0 < iVar22)) {
            pnVar37 = local_708;
            if (result_1.m_backend.fpclass != cpp_dec_float_NaN) {
              lowstab.m_backend.fpclass = cpp_dec_float_finite;
              lowstab.m_backend.prec_elem = 0x10;
              lowstab.m_backend.data._M_elems[0] = 0;
              lowstab.m_backend.data._M_elems[1] = 0;
              lowstab.m_backend.data._M_elems[2] = 0;
              lowstab.m_backend.data._M_elems[3] = 0;
              lowstab.m_backend.data._M_elems[4] = 0;
              lowstab.m_backend.data._M_elems[5] = 0;
              lowstab.m_backend.data._M_elems[6] = 0;
              lowstab.m_backend.data._M_elems[7] = 0;
              lowstab.m_backend.data._M_elems[8] = 0;
              lowstab.m_backend.data._M_elems[9] = 0;
              lowstab.m_backend.data._M_elems[10] = 0;
              lowstab.m_backend.data._M_elems[0xb] = 0;
              lowstab.m_backend.data._M_elems[0xc] = 0;
              lowstab.m_backend.data._M_elems[0xd] = 0;
              lowstab.m_backend.data._M_elems[0xe] = 0;
              lowstab.m_backend.data._M_elems[0xf] = 0;
              lowstab.m_backend.exp = 0;
              lowstab.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                        ((cpp_dec_float<100u,int,void> *)&lowstab.m_backend,0.0);
              iVar22 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                 (&result_1.m_backend,&lowstab.m_backend);
              pnVar37 = local_708;
              if (0 < iVar22) {
                pnVar37 = local_6d8;
              }
            }
            pnVar38 = pnVar37 + iVar24;
            local_768 = *(undefined1 (*) [16])(pnVar38->m_backend).data._M_elems;
            puVar33 = pnVar37[iVar24].m_backend.data._M_elems + 4;
            local_758 = *(undefined1 (*) [16])puVar33;
            puVar1 = pnVar37[iVar24].m_backend.data._M_elems + 8;
            local_748 = *(undefined1 (*) [16])puVar1;
            puVar2 = pnVar37[iVar24].m_backend.data._M_elems + 0xc;
            local_738._0_8_ = *(undefined8 *)puVar2;
            uVar32 = *(undefined8 *)(puVar2 + 2);
            stack0xfffffffffffff8d0 = (undefined5)uVar32;
            uStack_72b = (undefined3)((ulong)uVar32 >> 0x28);
            iStack_728 = pnVar37[iVar24].m_backend.exp;
            bStack_724 = pnVar37[iVar24].m_backend.neg;
            local_720._0_4_ = pnVar37[iVar24].m_backend.fpclass;
            local_720._4_4_ = pnVar37[iVar24].m_backend.prec_elem;
            x_1.m_backend.fpclass = cpp_dec_float_finite;
            x_1.m_backend.prec_elem = 0x10;
            x_1.m_backend.data._M_elems[0] = 0;
            x_1.m_backend.data._M_elems[1] = 0;
            x_1.m_backend.data._M_elems[2] = 0;
            x_1.m_backend.data._M_elems[3] = 0;
            x_1.m_backend.data._M_elems[4] = 0;
            x_1.m_backend.data._M_elems[5] = 0;
            x_1.m_backend.data._M_elems[6] = 0;
            x_1.m_backend.data._M_elems[7] = 0;
            x_1.m_backend.data._M_elems[8] = 0;
            x_1.m_backend.data._M_elems[9] = 0;
            x_1.m_backend.data._M_elems[10] = 0;
            x_1.m_backend.data._M_elems[0xb] = 0;
            x_1.m_backend.data._M_elems[0xc] = 0;
            x_1.m_backend.data._M_elems[0xd] = 0;
            x_1.m_backend.data._M_elems._56_5_ = 0;
            x_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            x_1.m_backend.exp = 0;
            x_1.m_backend.neg = false;
            if (&x_1.m_backend == &local_6d0[iVar24].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&x_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_768);
              if (x_1.m_backend.data._M_elems[0] != 0 ||
                  x_1.m_backend.fpclass != cpp_dec_float_finite) {
                x_1.m_backend.neg = (bool)(x_1.m_backend.neg ^ 1);
              }
            }
            else {
              x_1.m_backend.prec_elem = local_720._4_4_;
              x_1.m_backend.fpclass = (fpclass_type)local_720;
              x_1.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar38->m_backend).data._M_elems;
              x_1.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((pnVar38->m_backend).data._M_elems + 2);
              x_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar33;
              x_1.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar33 + 2);
              x_1.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
              x_1.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
              x_1.m_backend.data._M_elems._48_8_ = local_738._0_8_;
              x_1.m_backend.data._M_elems._56_5_ = stack0xfffffffffffff8d0;
              x_1.m_backend.data._M_elems[0xf]._1_3_ = uStack_72b;
              x_1.m_backend.exp = iStack_728;
              x_1.m_backend.neg = bStack_724;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (&x_1.m_backend,&local_6d0[iVar24].m_backend);
            }
            lowstab.m_backend.fpclass = cpp_dec_float_finite;
            lowstab.m_backend.prec_elem = 0x10;
            lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
            lowstab.m_backend.data._M_elems[8] = 0;
            lowstab.m_backend.data._M_elems[9] = 0;
            lowstab.m_backend.data._M_elems[10] = 0;
            lowstab.m_backend.data._M_elems[0xb] = 0;
            lowstab.m_backend.data._M_elems[0xc] = 0;
            lowstab.m_backend.data._M_elems[0xd] = 0;
            lowstab.m_backend.data._M_elems[0xe] = 0;
            lowstab.m_backend.data._M_elems[0xf] = 0;
            lowstab.m_backend.exp = 0;
            lowstab.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&lowstab.m_backend,&x_1.m_backend,&result_1.m_backend);
            local_748._12_4_ = lowstab.m_backend.data._M_elems[0xb];
            local_748._8_4_ = lowstab.m_backend.data._M_elems[10];
            local_738[1] = lowstab.m_backend.data._M_elems[0xd];
            local_738[0] = lowstab.m_backend.data._M_elems[0xc];
            stack0xfffffffffffff8d0 =
                 (undefined5)
                 CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe])
            ;
            uStack_72b = (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
            local_748._0_4_ = lowstab.m_backend.data._M_elems[8];
            local_748._4_4_ = lowstab.m_backend.data._M_elems[9];
            local_758._0_4_ = lowstab.m_backend.data._M_elems[4];
            local_758._4_4_ = lowstab.m_backend.data._M_elems[5];
            local_758._8_4_ = lowstab.m_backend.data._M_elems[6];
            local_758._12_4_ = lowstab.m_backend.data._M_elems[7];
            local_768._0_4_ = lowstab.m_backend.data._M_elems[0];
            local_768._4_4_ = lowstab.m_backend.data._M_elems[1];
            local_768._8_4_ = lowstab.m_backend.data._M_elems[2];
            local_768._12_4_ = lowstab.m_backend.data._M_elems[3];
            iStack_728 = lowstab.m_backend.exp;
            bStack_724 = lowstab.m_backend.neg;
            local_720._0_4_ = lowstab.m_backend.fpclass;
            local_720._4_4_ = lowstab.m_backend.prec_elem;
            if (((lowstab.m_backend.fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_630 != cpp_dec_float_NaN)) &&
               (iVar24 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   ((cpp_dec_float<100U,_int,_void> *)local_768,
                                    (cpp_dec_float<100U,_int,_void> *)local_678), iVar24 < 1)) {
              local_628.neg = result_1.m_backend.neg;
              if (result_1.m_backend.neg == true) {
                local_628.neg =
                     result_1.m_backend.fpclass == cpp_dec_float_finite &&
                     result_1.m_backend.data._M_elems[0] == 0;
              }
              local_628.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              pnVar38 = &result_1;
              local_628.exp = result_1.m_backend.exp;
              local_628._72_8_ = result_1.m_backend._72_8_;
LAB_00489eb7:
              puVar33 = (pnVar38->m_backend).data._M_elems + 1;
              local_628.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)(puVar33 + 0xb) >> 0x20);
              local_628.data._M_elems._56_5_ = SUB85(*(undefined8 *)(puVar33 + 0xd),0);
              local_628.data._M_elems[0xf]._1_3_ =
                   (undefined3)((ulong)*(undefined8 *)(puVar33 + 0xd) >> 0x28);
              local_628.data._M_elems[9] = (uint)*(undefined8 *)(puVar33 + 8);
              local_628.data._M_elems[10] = (uint)((ulong)*(undefined8 *)(puVar33 + 8) >> 0x20);
              local_628.data._M_elems[0xb] = (uint)*(undefined8 *)(puVar33 + 10);
              local_628.data._M_elems[0xc] = (uint)((ulong)*(undefined8 *)(puVar33 + 10) >> 0x20);
              local_628.data._M_elems[5] = (uint)*(undefined8 *)(puVar33 + 4);
              local_628.data._M_elems[6] = (uint)((ulong)*(undefined8 *)(puVar33 + 4) >> 0x20);
              local_628.data._M_elems[7] = (uint)*(undefined8 *)(puVar33 + 6);
              local_628.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(puVar33 + 6) >> 0x20);
              local_628.data._M_elems[1] = (uint)*(undefined8 *)puVar33;
              local_628.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar33 >> 0x20);
              local_628.data._M_elems[3] = (uint)*(undefined8 *)(puVar33 + 2);
              local_628.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar33 + 2) >> 0x20);
              uVar40 = (uint)uVar41;
            }
          }
          goto LAB_00489efe;
        }
        pBVar7[uVar41].idx = -1;
        pUVar36 = pSVar31->theCoPvec;
LAB_0048952d:
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearIdx(&pUVar36->thedelta,iVar24);
      }
      uVar45 = uVar41 & 0xffffffff;
      uVar41 = uVar41 + 1;
    } while ((long)uVar41 < (long)nBp);
  }
  local_5d0 = (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&(this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).fastDelta;
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems[6] = 0;
  lowstab.m_backend.data._M_elems[7] = 0;
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&lowstab.m_backend,(cpp_dec_float<100U,_int,_void> *)local_5d0,&local_628);
  bVar19 = lowstab.m_backend.neg;
  uVar17 = lowstab.m_backend.data._M_elems._32_8_;
  uVar32 = lowstab.m_backend.data._M_elems._0_8_;
  uVar28 = lowstab.m_backend.data._M_elems._8_8_;
  uVar27 = lowstab.m_backend.data._M_elems._16_8_;
  uVar26 = lowstab.m_backend.data._M_elems._24_8_;
  uVar10._4_4_ = lowstab.m_backend.data._M_elems[0xb];
  uVar10._0_4_ = lowstab.m_backend.data._M_elems[10];
  uVar11._4_4_ = lowstab.m_backend.data._M_elems[0xd];
  uVar11._0_4_ = lowstab.m_backend.data._M_elems[0xc];
  uVar12._4_4_ = lowstab.m_backend.data._M_elems[0xf];
  uVar12._0_4_ = lowstab.m_backend.data._M_elems[0xe];
  local_718 = CONCAT44(local_718._4_4_,lowstab.m_backend.exp);
  fVar23 = lowstab.m_backend.fpclass;
  local_848 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT44(local_848._4_4_,lowstab.m_backend.prec_elem);
  bVar44 = ((this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .thesolver)->instableLeave;
  peVar9 = (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar3 = peVar9->s_epsilon_multiplier;
  uVar45 = -(ulong)(dVar3 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 0x10;
  lowstab.m_backend.data._M_elems._0_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems._16_16_ = ZEXT816(0);
  lowstab.m_backend.data._M_elems[8] = 0;
  lowstab.m_backend.data._M_elems[9] = 0;
  lowstab.m_backend.data._M_elems[10] = 0;
  lowstab.m_backend.data._M_elems[0xb] = 0;
  lowstab.m_backend.data._M_elems[0xc] = 0;
  lowstab.m_backend.data._M_elems[0xd] = 0;
  lowstab.m_backend.data._M_elems[0xe] = 0;
  lowstab.m_backend.data._M_elems[0xf] = 0;
  lowstab.m_backend.exp = 0;
  lowstab.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&lowstab,
             (double)(~uVar45 & (ulong)(dVar3 * 1e-10) | uVar45 & 0x3ddb7cdfd9d7bdbb));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (bVar44 == false) {
    local_88.m_backend.data._M_elems[1] = local_628.data._M_elems[1];
    local_88.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
    local_88.m_backend.data._M_elems[3] = local_628.data._M_elems[3];
    local_88.m_backend.data._M_elems[2] = local_628.data._M_elems[2];
    local_88.m_backend.data._M_elems[5] = local_628.data._M_elems[5];
    local_88.m_backend.data._M_elems[4] = local_628.data._M_elems[4];
    local_88.m_backend.data._M_elems[7] = local_628.data._M_elems[7];
    local_88.m_backend.data._M_elems[6] = local_628.data._M_elems[6];
    local_88.m_backend.data._M_elems[9] = local_628.data._M_elems[9];
    local_88.m_backend.data._M_elems[8] = local_628.data._M_elems[8];
    local_88.m_backend.data._M_elems[0xb] = local_628.data._M_elems[0xb];
    local_88.m_backend.data._M_elems[10] = local_628.data._M_elems[10];
    local_88.m_backend.data._M_elems[0xd] = local_628.data._M_elems[0xd];
    local_88.m_backend.data._M_elems[0xc] = local_628.data._M_elems[0xc];
    local_88.m_backend.data._M_elems[0xf]._1_3_ = local_628.data._M_elems[0xf]._1_3_;
    local_88.m_backend.data._M_elems._56_5_ = local_628.data._M_elems._56_5_;
    local_88.m_backend.exp = local_628.exp;
    local_88.m_backend.neg = local_628.neg;
    local_88.m_backend.fpclass = local_628.fpclass;
    local_88.m_backend.prec_elem = local_628.prec_elem;
    SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::minStability(&result_1,
                   &this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,&local_88);
    pnVar38 = &result_1;
    iVar21 = result_1.m_backend.exp;
    uVar35 = result_1.m_backend.neg;
    fVar43 = result_1.m_backend.fpclass;
  }
  else {
    pnVar38 = &lowstab;
    result_1.m_backend.data._M_elems[0xb] = lowstab.m_backend.data._M_elems[0xb];
    result_1.m_backend.data._M_elems[10] = lowstab.m_backend.data._M_elems[10];
    result_1.m_backend.data._M_elems[0xc] = lowstab.m_backend.data._M_elems[0xc];
    result_1.m_backend.data._M_elems[0xd] = lowstab.m_backend.data._M_elems[0xd];
    result_1.m_backend.data._M_elems._56_5_ =
         SUB85(CONCAT44(lowstab.m_backend.data._M_elems[0xf],lowstab.m_backend.data._M_elems[0xe]),0
              );
    result_1.m_backend.data._M_elems[0xf]._1_3_ =
         (undefined3)(lowstab.m_backend.data._M_elems[0xf] >> 8);
    result_1.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    result_1.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
    result_1.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    result_1.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    result_1.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    result_1.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
    result_1.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    result_1.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    result_1.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    result_1.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    iVar21 = lowstab.m_backend.exp;
    uVar35 = lowstab.m_backend.neg;
    fVar43 = lowstab.m_backend.fpclass;
  }
  auVar20 = (undefined1  [16])result_1.m_backend.data._M_elems._32_16_;
  auVar16 = (undefined1  [16])result_1.m_backend.data._M_elems._16_16_;
  auVar13 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
  iVar5 = (pnVar38->m_backend).prec_elem;
  stab.m_backend.data._M_elems[0xc] = result_1.m_backend.data._M_elems[0xc];
  stab.m_backend.data._M_elems[0xd] = result_1.m_backend.data._M_elems[0xd];
  stab.m_backend.data._M_elems._56_5_ = result_1.m_backend.data._M_elems._56_5_;
  stab.m_backend.data._M_elems[0xf]._1_3_ = result_1.m_backend.data._M_elems[0xf]._1_3_;
  stab.m_backend.data._M_elems[8] = result_1.m_backend.data._M_elems[8];
  stab.m_backend.data._M_elems[9] = result_1.m_backend.data._M_elems[9];
  stab.m_backend.data._M_elems[10] = result_1.m_backend.data._M_elems[10];
  stab.m_backend.data._M_elems[0xb] = result_1.m_backend.data._M_elems[0xb];
  stab.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  stab.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  stab.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
  stab.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
  stab.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  stab.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  stab.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  stab.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  stab.m_backend.prec_elem = iVar5;
  stab.m_backend.fpclass = fVar43;
  result_1.m_backend.data._M_elems._0_16_ = auVar13;
  result_1.m_backend.data._M_elems._16_16_ = auVar16;
  result_1.m_backend.data._M_elems._32_16_ = auVar20;
  stab.m_backend.exp = iVar21;
  stab.m_backend.neg = (bool)uVar35;
  if ((int)uVar40 < 0) {
    uVar45 = (ulong)local_83c;
    uVar42 = local_83c;
    if (-1 < (int)local_83c) {
      do {
        while( true ) {
          local_83c = uVar42;
          uVar18 = lowstab.m_backend.data._M_elems._32_8_;
          auVar16 = (undefined1  [16])lowstab.m_backend.data._M_elems._16_16_;
          auVar13 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_;
          pBVar7 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar24 = pBVar7[uVar45].idx;
          uVar40 = (uint)uVar45;
          if (iVar24 < 0) break;
          bVar44 = pBVar7[uVar45].src == PVEC;
          if (bVar44) {
            local_358.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
            local_358.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
            local_358.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
            local_358.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
            local_358.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
            local_358.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
            local_358.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
            local_358.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
            local_358.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
            local_358.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
            local_358.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
            local_358.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
            local_358.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
            local_358.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
            local_358.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
            local_358.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[0] = (uint)uVar32;
            lowstab.m_backend.data._M_elems[1] = SUB84(uVar32,4);
            local_3a8.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
            local_3a8.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
            lowstab.m_backend.data._M_elems[2] = (uint)uVar28;
            lowstab.m_backend.data._M_elems[3] = SUB84(uVar28,4);
            local_3a8.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
            local_3a8.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[4] = (uint)uVar27;
            lowstab.m_backend.data._M_elems[5] = SUB84(uVar27,4);
            local_3a8.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
            local_3a8.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
            lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
            lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
            local_3a8.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
            local_3a8.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
            lowstab.m_backend.data._M_elems[8] = (uint)uVar17;
            lowstab.m_backend.data._M_elems[9] = SUB84(uVar17,4);
            local_3a8.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
            local_3a8.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
            local_3a8.m_backend.exp = (int)local_718;
            local_3a8.m_backend.neg = bVar19;
            local_3a8.m_backend.fpclass = fVar23;
            local_3a8.m_backend.prec_elem = (int32_t)local_848;
            local_2b8.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
            local_2b8.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
            local_2b8.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
            local_2b8.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
            local_2b8.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
            local_2b8.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
            local_2b8.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
            local_2b8.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
            local_2b8.m_backend.data._M_elems[8] = local_6c8.data._M_elems[8];
            local_2b8.m_backend.data._M_elems[9] = local_6c8.data._M_elems[9];
            local_2b8.m_backend.data._M_elems[10] = local_6c8.data._M_elems[10];
            local_2b8.m_backend.data._M_elems[0xb] = local_6c8.data._M_elems[0xb];
            local_2b8.m_backend.data._M_elems[0xc] = local_6c8.data._M_elems[0xc];
            local_2b8.m_backend.data._M_elems[0xd] = local_6c8.data._M_elems[0xd];
            local_2b8.m_backend.data._M_elems[0xe] = local_6c8.data._M_elems[0xe];
            local_2b8.m_backend.data._M_elems[0xf] = local_6c8.data._M_elems[0xf];
            local_2b8.m_backend.exp = local_6c8.exp;
            local_2b8.m_backend.neg = local_6c8.neg;
            local_2b8.m_backend.fpclass = local_6c8.fpclass;
            local_2b8.m_backend.prec_elem = local_6c8.prec_elem;
            pnVar38 = &local_358;
            pnVar39 = &local_3a8;
            pnVar49 = &local_2b8;
            pnVar37 = local_700;
            pnVar46 = local_6e0;
            pnVar47 = local_710;
            pnVar48 = local_6e8;
            local_3a8.m_backend.data._M_elems._40_8_ = uVar10;
            local_3a8.m_backend.data._M_elems._48_8_ = uVar11;
            local_3a8.m_backend.data._M_elems._56_8_ = uVar12;
            local_358.m_backend.exp = iVar21;
            local_358.m_backend.neg = (bool)uVar35;
            local_358.m_backend.fpclass = fVar43;
            local_358.m_backend.prec_elem = iVar5;
          }
          else {
            local_3f8.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
            local_3f8.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
            local_3f8.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
            local_3f8.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
            local_3f8.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
            local_3f8.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
            local_3f8.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
            local_3f8.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
            local_3f8.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
            local_3f8.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
            local_3f8.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
            local_3f8.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
            local_3f8.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
            local_3f8.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
            local_3f8.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
            local_3f8.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[0] = (uint)uVar32;
            lowstab.m_backend.data._M_elems[1] = SUB84(uVar32,4);
            local_448.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
            local_448.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
            lowstab.m_backend.data._M_elems[2] = (uint)uVar28;
            lowstab.m_backend.data._M_elems[3] = SUB84(uVar28,4);
            local_448.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
            local_448.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
            lowstab.m_backend.data._M_elems[4] = (uint)uVar27;
            lowstab.m_backend.data._M_elems[5] = SUB84(uVar27,4);
            local_448.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
            local_448.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
            lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
            lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
            local_448.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
            local_448.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
            lowstab.m_backend.data._M_elems[8] = (uint)uVar17;
            lowstab.m_backend.data._M_elems[9] = SUB84(uVar17,4);
            local_448.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
            local_448.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
            local_448.m_backend.exp = (int)local_718;
            local_448.m_backend.neg = bVar19;
            local_448.m_backend.fpclass = fVar23;
            local_448.m_backend.prec_elem = (int32_t)local_848;
            local_308.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
            local_308.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
            local_308.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
            local_308.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
            local_308.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
            local_308.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
            local_308.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
            local_308.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
            local_308.m_backend.data._M_elems[8] = local_6c8.data._M_elems[8];
            local_308.m_backend.data._M_elems[9] = local_6c8.data._M_elems[9];
            local_308.m_backend.data._M_elems[10] = local_6c8.data._M_elems[10];
            local_308.m_backend.data._M_elems[0xb] = local_6c8.data._M_elems[0xb];
            local_308.m_backend.data._M_elems[0xc] = local_6c8.data._M_elems[0xc];
            local_308.m_backend.data._M_elems[0xd] = local_6c8.data._M_elems[0xd];
            local_308.m_backend.data._M_elems[0xe] = local_6c8.data._M_elems[0xe];
            local_308.m_backend.data._M_elems[0xf] = local_6c8.data._M_elems[0xf];
            local_308.m_backend.exp = local_6c8.exp;
            local_308.m_backend.neg = local_6c8.neg;
            local_308.m_backend.fpclass = local_6c8.fpclass;
            local_308.m_backend.prec_elem = local_6c8.prec_elem;
            pnVar38 = &local_3f8;
            pnVar39 = &local_448;
            pnVar49 = &local_308;
            pnVar37 = local_6f8;
            pnVar46 = local_6d0;
            pnVar47 = local_708;
            pnVar48 = local_6d8;
            local_448.m_backend.data._M_elems._40_8_ = uVar10;
            local_448.m_backend.data._M_elems._48_8_ = uVar11;
            local_448.m_backend.data._M_elems._56_8_ = uVar12;
            local_3f8.m_backend.exp = iVar21;
            local_3f8.m_backend.neg = (bool)uVar35;
            local_3f8.m_backend.fpclass = fVar43;
            local_3f8.m_backend.prec_elem = iVar5;
          }
          lowstab.m_backend.data._M_elems._0_16_ = auVar13;
          lowstab.m_backend.data._M_elems._16_16_ = auVar16;
          lowstab.m_backend.data._M_elems._32_8_ = uVar18;
          bVar44 = getData(this,val,&enterId,iVar24,pnVar38,pnVar39,pnVar37,pnVar46,pnVar47,pnVar48,
                           (uint)!bVar44,pnVar49);
          uVar45 = (ulong)(uVar40 - 1);
          local_83c = uVar40;
          if ((bVar44) || (uVar42 = uVar40 - 1, (int)uVar40 < 1)) goto LAB_0048a8c3;
        }
        uVar45 = (ulong)(uVar40 - 1);
        uVar42 = local_83c;
      } while (uVar40 != 0);
    }
LAB_0048a9dd:
    if (this->relax_count < 2) {
      SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::relax(&this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
      this->relax_count = this->relax_count + 1;
      *(undefined8 *)((val->m_backend).data._M_elems + 0xc) = local_6c8.data._M_elems._48_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 0xe) = local_6c8.data._M_elems._56_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 8) = local_6c8.data._M_elems._32_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 10) = local_6c8.data._M_elems._40_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_6c8.data._M_elems._16_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 6) = local_6c8.data._M_elems._24_8_;
      *(undefined8 *)(val->m_backend).data._M_elems = local_6c8.data._M_elems._0_8_;
      *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_6c8.data._M_elems._8_8_;
      (val->m_backend).exp = local_6c8.exp;
      (val->m_backend).neg = local_6c8.neg;
      (val->m_backend).fpclass = local_6c8.fpclass;
      (val->m_backend).prec_elem = local_6c8.prec_elem;
      enterId = selectEnter(this,val,leaveIdx,false);
    }
    return (SPxId)enterId.super_DataKey;
  }
  if ((fVar43 == cpp_dec_float_NaN || local_628.fpclass == cpp_dec_float_NaN) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_628,&stab.m_backend),
     uVar18 = lowstab.m_backend.data._M_elems._32_8_,
     auVar16 = (undefined1  [16])lowstab.m_backend.data._M_elems._16_16_,
     auVar13 = (undefined1  [16])lowstab.m_backend.data._M_elems._0_16_, iVar21 < 1))
  goto LAB_0048a9dd;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar44 = pBVar7[uVar40].src == PVEC;
  if (bVar44) {
    local_d8.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
    local_d8.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
    pnVar38 = &local_d8;
    local_d8.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
    local_d8.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
    local_d8.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
    local_d8.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
    local_d8.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
    local_d8.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
    local_d8.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
    local_d8.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
    local_d8.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
    local_d8.m_backend.exp = stab.m_backend.exp;
    local_d8.m_backend.neg = stab.m_backend.neg;
    local_d8.m_backend.fpclass = stab.m_backend.fpclass;
    local_d8.m_backend.prec_elem = stab.m_backend.prec_elem;
    pnVar39 = &local_128;
    lowstab.m_backend.data._M_elems[0] = (uint)uVar32;
    lowstab.m_backend.data._M_elems[1] = SUB84(uVar32,4);
    local_128.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    lowstab.m_backend.data._M_elems[2] = (uint)uVar28;
    lowstab.m_backend.data._M_elems[3] = SUB84(uVar28,4);
    local_128.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    lowstab.m_backend.data._M_elems[4] = (uint)uVar27;
    lowstab.m_backend.data._M_elems[5] = SUB84(uVar27,4);
    local_128.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
    lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
    local_128.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
    lowstab.m_backend.data._M_elems[8] = (uint)uVar17;
    lowstab.m_backend.data._M_elems[9] = SUB84(uVar17,4);
    local_128.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
    local_128.m_backend.exp = (int)local_718;
    local_128.m_backend.neg = bVar19;
    local_128.m_backend.fpclass = fVar23;
    local_128.m_backend.prec_elem = (int32_t)local_848;
    pnVar49 = &local_178;
    local_178.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = local_6c8.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = local_6c8.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = local_6c8.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = local_6c8.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = local_6c8.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = local_6c8.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = local_6c8.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = local_6c8.data._M_elems[0xf];
    local_178.m_backend.exp = local_6c8.exp;
    local_178.m_backend.neg = local_6c8.neg;
    local_178.m_backend.fpclass = local_6c8.fpclass;
    local_178.m_backend.prec_elem = local_6c8.prec_elem;
    pnVar37 = local_700;
    pnVar46 = local_6e0;
    pnVar47 = local_710;
    pnVar48 = local_6e8;
    local_128.m_backend.data._M_elems._40_8_ = uVar10;
    local_128.m_backend.data._M_elems._48_8_ = uVar11;
    local_128.m_backend.data._M_elems._56_8_ = uVar12;
  }
  else {
    local_1c8.m_backend.data._M_elems[0xf]._1_3_ = stab.m_backend.data._M_elems[0xf]._1_3_;
    local_1c8.m_backend.data._M_elems._56_5_ = stab.m_backend.data._M_elems._56_5_;
    pnVar38 = &local_1c8;
    local_1c8.m_backend.data._M_elems[0xc] = stab.m_backend.data._M_elems[0xc];
    local_1c8.m_backend.data._M_elems[0xd] = stab.m_backend.data._M_elems[0xd];
    local_1c8.m_backend.data._M_elems[8] = stab.m_backend.data._M_elems[8];
    local_1c8.m_backend.data._M_elems[9] = stab.m_backend.data._M_elems[9];
    local_1c8.m_backend.data._M_elems[10] = stab.m_backend.data._M_elems[10];
    local_1c8.m_backend.data._M_elems[0xb] = stab.m_backend.data._M_elems[0xb];
    local_1c8.m_backend.data._M_elems[4] = stab.m_backend.data._M_elems[4];
    local_1c8.m_backend.data._M_elems[5] = stab.m_backend.data._M_elems[5];
    local_1c8.m_backend.data._M_elems[6] = stab.m_backend.data._M_elems[6];
    local_1c8.m_backend.data._M_elems[7] = stab.m_backend.data._M_elems[7];
    local_1c8.m_backend.data._M_elems[0] = stab.m_backend.data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = stab.m_backend.data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = stab.m_backend.data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = stab.m_backend.data._M_elems[3];
    local_1c8.m_backend.exp = stab.m_backend.exp;
    local_1c8.m_backend.neg = stab.m_backend.neg;
    local_1c8.m_backend.fpclass = stab.m_backend.fpclass;
    local_1c8.m_backend.prec_elem = stab.m_backend.prec_elem;
    pnVar39 = &local_218;
    lowstab.m_backend.data._M_elems[0] = (uint)uVar32;
    lowstab.m_backend.data._M_elems[1] = SUB84(uVar32,4);
    local_218.m_backend.data._M_elems[0] = lowstab.m_backend.data._M_elems[0];
    local_218.m_backend.data._M_elems[1] = lowstab.m_backend.data._M_elems[1];
    lowstab.m_backend.data._M_elems[2] = (uint)uVar28;
    lowstab.m_backend.data._M_elems[3] = SUB84(uVar28,4);
    local_218.m_backend.data._M_elems[2] = lowstab.m_backend.data._M_elems[2];
    local_218.m_backend.data._M_elems[3] = lowstab.m_backend.data._M_elems[3];
    lowstab.m_backend.data._M_elems[4] = (uint)uVar27;
    lowstab.m_backend.data._M_elems[5] = SUB84(uVar27,4);
    local_218.m_backend.data._M_elems[4] = lowstab.m_backend.data._M_elems[4];
    local_218.m_backend.data._M_elems[5] = lowstab.m_backend.data._M_elems[5];
    lowstab.m_backend.data._M_elems[6] = (uint)uVar26;
    lowstab.m_backend.data._M_elems[7] = SUB84(uVar26,4);
    local_218.m_backend.data._M_elems[6] = lowstab.m_backend.data._M_elems[6];
    local_218.m_backend.data._M_elems[7] = lowstab.m_backend.data._M_elems[7];
    lowstab.m_backend.data._M_elems[8] = (uint)uVar17;
    lowstab.m_backend.data._M_elems[9] = SUB84(uVar17,4);
    local_218.m_backend.data._M_elems[8] = lowstab.m_backend.data._M_elems[8];
    local_218.m_backend.data._M_elems[9] = lowstab.m_backend.data._M_elems[9];
    local_218.m_backend.exp = (int)local_718;
    local_218.m_backend.neg = bVar19;
    local_218.m_backend.fpclass = fVar23;
    local_218.m_backend.prec_elem = (int32_t)local_848;
    pnVar49 = &local_268;
    local_268.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
    local_268.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
    local_268.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
    local_268.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
    local_268.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
    local_268.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
    local_268.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
    local_268.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
    local_268.m_backend.data._M_elems[8] = local_6c8.data._M_elems[8];
    local_268.m_backend.data._M_elems[9] = local_6c8.data._M_elems[9];
    local_268.m_backend.data._M_elems[10] = local_6c8.data._M_elems[10];
    local_268.m_backend.data._M_elems[0xb] = local_6c8.data._M_elems[0xb];
    local_268.m_backend.data._M_elems[0xc] = local_6c8.data._M_elems[0xc];
    local_268.m_backend.data._M_elems[0xd] = local_6c8.data._M_elems[0xd];
    local_268.m_backend.data._M_elems[0xe] = local_6c8.data._M_elems[0xe];
    local_268.m_backend.data._M_elems[0xf] = local_6c8.data._M_elems[0xf];
    local_268.m_backend.exp = local_6c8.exp;
    local_268.m_backend.neg = local_6c8.neg;
    local_268.m_backend.fpclass = local_6c8.fpclass;
    local_268.m_backend.prec_elem = local_6c8.prec_elem;
    pnVar37 = local_6f8;
    pnVar46 = local_6d0;
    pnVar47 = local_708;
    pnVar48 = local_6d8;
    local_218.m_backend.data._M_elems._40_8_ = uVar10;
    local_218.m_backend.data._M_elems._48_8_ = uVar11;
    local_218.m_backend.data._M_elems._56_8_ = uVar12;
  }
  lowstab.m_backend.data._M_elems._0_16_ = auVar13;
  lowstab.m_backend.data._M_elems._16_16_ = auVar16;
  lowstab.m_backend.data._M_elems._32_8_ = uVar18;
  bVar44 = getData(this,val,&enterId,pBVar7[uVar40].idx,pnVar38,pnVar39,pnVar37,pnVar46,pnVar47,
                   pnVar48,(uint)!bVar44,pnVar49);
LAB_0048a8c3:
  if (bVar44 == false) goto LAB_0048a9dd;
  this->relax_count = 0;
  SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tighten(&this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           );
  lVar29 = (long)(int)local_83c;
  if (0 < lVar29) {
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    result_1.m_backend.exp = *(int *)((long)&pBVar7[lVar29].val.m_backend + 0x40);
    result_1.m_backend.neg = *(bool *)((long)&pBVar7[lVar29].val.m_backend + 0x44);
    result_1.m_backend._72_8_ = *(undefined8 *)((long)&pBVar7[lVar29].val.m_backend + 0x48);
    auVar13 = *(undefined1 (*) [16])&pBVar7[lVar29].val.m_backend;
    result_1.m_backend.data._M_elems._8_8_ = auVar13._8_8_;
    result_1.m_backend.data._M_elems._16_16_ =
         *(undefined1 (*) [16])((long)&pBVar7[lVar29].val.m_backend + 0x10);
    result_1.m_backend.data._M_elems._32_16_ =
         *(undefined1 (*) [16])((long)&pBVar7[lVar29].val.m_backend + 0x20);
    puVar33 = (uint *)((long)&pBVar7[lVar29].val.m_backend + 0x30);
    result_1.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar33;
    uVar32 = *(undefined8 *)(puVar33 + 2);
    result_1.m_backend.data._M_elems._56_5_ = SUB85(uVar32,0);
    result_1.m_backend.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar32 >> 0x28);
    if ((result_1.m_backend.neg == true) &&
       (result_1.m_backend.data._M_elems[0] =
             (uint)*(undefined8 *)&pBVar7[lVar29].val.m_backend.data,
       result_1.m_backend.data._M_elems[0] != 0 ||
       result_1.m_backend.fpclass != cpp_dec_float_finite)) {
      result_1.m_backend.neg = false;
    }
    if ((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->
        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).fastDelta.m_backend.fpclass != cpp_dec_float_NaN)) {
      result_1.m_backend.data._M_elems._0_16_ = auVar13;
      iVar21 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&result_1.m_backend,(cpp_dec_float<100U,_int,_void> *)local_5d0);
      if (0 < iVar21) {
        flipAndUpdate(this,(int *)&local_83c);
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = local_83c;
        if (9 < (int)local_83c) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_6f0,1);
          uVar27._0_4_ = enterId.super_DataKey.info;
          uVar27._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar27;
        }
        uVar32 = 0x3fa999999999999a;
        goto LAB_0048aa7f;
      }
    }
  }
  ((this->
   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .thesolver)->boundflips = 0;
  uVar32 = 0x3fb999999999999a;
LAB_0048aa7f:
  result_1.m_backend.data._M_elems[0] = (int)uVar32;
  result_1.m_backend.data._M_elems[1] = (int)((ulong)uVar32 >> 0x20);
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
  ::operator-=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                *)local_6f0,(double *)&result_1);
  uVar26._0_4_ = enterId.super_DataKey.info;
  uVar26._4_4_ = enterId.super_DataKey.idx;
  return (SPxId)uVar26;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}